

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O1

ostream * CLI::detail::streamOutAsParagraph
                    (ostream *out,string *text,size_t paragraphWidth,string *linePrefix,
                    bool skipPrefixOnFirstLine)

{
  char cVar1;
  istream *piVar2;
  ostream *poVar3;
  long lVar4;
  undefined3 in_register_00000081;
  string word;
  string line;
  istringstream lss;
  istringstream iss;
  char local_371;
  char *local_370;
  long local_368;
  char local_360 [16];
  undefined1 *local_350 [2];
  undefined1 local_340 [16];
  long local_330 [4];
  byte abStack_310 [88];
  ios_base local_2b8 [264];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  if (CONCAT31(in_register_00000081,skipPrefixOnFirstLine) == 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              (out,(linePrefix->_M_dataplus)._M_p,linePrefix->_M_string_length);
  }
  ::std::__cxx11::istringstream::istringstream((istringstream *)local_330,(string *)text,_S_in);
  local_350[0] = local_340;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"");
  while( true ) {
    cVar1 = ::std::ios::widen((char)*(undefined8 *)(local_330[0] + -0x18) +
                              (char)(istream *)local_330);
    piVar2 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_330,(string *)local_350,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    ::std::__cxx11::istringstream::istringstream(local_1b0,(string *)local_350,_S_in);
    local_370 = local_360;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"");
    lVar4 = 0;
    while( true ) {
      piVar2 = ::std::operator>>((istream *)local_1b0,(string *)&local_370);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      if (paragraphWidth < (ulong)(local_368 + lVar4)) {
        local_371 = '\n';
        poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>(out,&local_371,1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(linePrefix->_M_dataplus)._M_p,linePrefix->_M_string_length);
        lVar4 = 0;
      }
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>(out,local_370,local_368);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      lVar4 = lVar4 + local_368 + 1;
    }
    if ((abStack_310[*(long *)(local_330[0] + -0x18)] & 2) == 0) {
      local_371 = '\n';
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>(out,&local_371,1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(linePrefix->_M_dataplus)._M_p,linePrefix->_M_string_length);
    }
    if (local_370 != local_360) {
      operator_delete(local_370);
    }
    ::std::__cxx11::istringstream::~istringstream(local_1b0);
    ::std::ios_base::~ios_base(local_138);
  }
  if (local_350[0] != local_340) {
    operator_delete(local_350[0]);
  }
  ::std::__cxx11::istringstream::~istringstream((istringstream *)local_330);
  ::std::ios_base::~ios_base(local_2b8);
  return out;
}

Assistant:

CLI11_INLINE std::ostream &streamOutAsParagraph(std::ostream &out,
                                                const std::string &text,
                                                std::size_t paragraphWidth,
                                                const std::string &linePrefix,
                                                bool skipPrefixOnFirstLine) {
    if(!skipPrefixOnFirstLine)
        out << linePrefix;  // First line prefix

    std::istringstream lss(text);
    std::string line = "";
    while(std::getline(lss, line)) {
        std::istringstream iss(line);
        std::string word = "";
        std::size_t charsWritten = 0;

        while(iss >> word) {
            if(word.length() + charsWritten > paragraphWidth) {
                out << '\n' << linePrefix;
                charsWritten = 0;
            }

            out << word << " ";
            charsWritten += word.length() + 1;
        }

        if(!lss.eof())
            out << '\n' << linePrefix;
    }
    return out;
}